

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void google::protobuf::anon_unknown_12::ByteSizeConsistencyError
               (size_t byte_size_before_serialization,size_t byte_size_after_serialization,
               size_t bytes_produced_by_serialization,MessageLite *message)

{
  LogMessage *pLVar1;
  LogFinisher local_141;
  LogMessage local_140;
  LogFinisher local_102;
  byte local_101;
  string local_100;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9a;
  byte local_99;
  string local_98;
  byte local_61;
  LogMessage local_60;
  MessageLite *local_28;
  MessageLite *message_local;
  size_t bytes_produced_by_serialization_local;
  size_t byte_size_after_serialization_local;
  size_t byte_size_before_serialization_local;
  
  local_61 = 0;
  local_99 = 0;
  local_28 = message;
  message_local = (MessageLite *)bytes_produced_by_serialization;
  bytes_produced_by_serialization_local = byte_size_after_serialization;
  byte_size_after_serialization_local = byte_size_before_serialization;
  if (byte_size_before_serialization != byte_size_after_serialization) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x44);
    local_61 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                       );
    (*local_28->_vptr_MessageLite[2])(&local_98);
    local_99 = 1;
    pLVar1 = internal::LogMessage::operator<<(pLVar1,&local_98);
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1," was modified concurrently during serialization.");
    internal::LogFinisher::operator=(&local_9a,pLVar1);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_d9 = 0;
  local_101 = 0;
  if (message_local != (MessageLite *)byte_size_after_serialization_local) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x47);
    local_d9 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                       );
    (*local_28->_vptr_MessageLite[2])(&local_100);
    local_101 = 1;
    pLVar1 = internal::LogMessage::operator<<(pLVar1,&local_100);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,".");
    internal::LogFinisher::operator=(&local_102,pLVar1);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
  }
  if ((local_d9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_d8);
  }
  internal::LogMessage::LogMessage
            (&local_140,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
             ,0x4b);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_140,"This shouldn\'t be called if all the sizes are equal.");
  internal::LogFinisher::operator=(&local_141,pLVar1);
  internal::LogMessage::~LogMessage(&local_140);
  return;
}

Assistant:

void ByteSizeConsistencyError(size_t byte_size_before_serialization,
                              size_t byte_size_after_serialization,
                              size_t bytes_produced_by_serialization,
                              const MessageLite& message) {
  GOOGLE_CHECK_EQ(byte_size_before_serialization, byte_size_after_serialization)
      << message.GetTypeName()
      << " was modified concurrently during serialization.";
  GOOGLE_CHECK_EQ(bytes_produced_by_serialization, byte_size_before_serialization)
      << "Byte size calculation and serialization were inconsistent.  This "
         "may indicate a bug in protocol buffers or it may be caused by "
         "concurrent modification of " << message.GetTypeName() << ".";
  GOOGLE_LOG(FATAL) << "This shouldn't be called if all the sizes are equal.";
}